

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *pEVar1;
  SyntaxNode *this;
  bool bVar2;
  Type *pTVar3;
  Scope *this_00;
  Symbol *this_01;
  FieldSymbol *pFVar4;
  SourceLocation location;
  Expression *pEVar5;
  TaggedUnionExpression *expr;
  Diagnostic *pDVar6;
  string_view name;
  SourceRange SVar7;
  Expression *valueExpr;
  Expression *local_50;
  Symbol *local_48;
  Token local_40;
  
  if (assignmentTarget != (Type *)0x0) {
    bVar2 = Type::isTaggedUnion(assignmentTarget);
    if (bVar2) {
      name = parsing::Token::valueText(&syntax->member);
      pTVar3 = Type::getCanonicalType(assignmentTarget);
      this_00 = Symbol::as<slang::ast::Scope>(&pTVar3->super_Symbol);
      this_01 = Scope::find(this_00,name);
      if (this_01 != (Symbol *)0x0) {
        local_48 = this_01;
        pFVar4 = Symbol::as<slang::ast::FieldSymbol>(this_01);
        local_50 = (Expression *)0x0;
        pEVar1 = syntax->expr;
        pTVar3 = DeclaredType::getType
                           (&(pFVar4->super_VariableSymbol).super_ValueSymbol.declaredType);
        if (pEVar1 == (ExpressionSyntax *)0x0) {
          bVar2 = Type::isVoid(pTVar3);
          if (!bVar2) {
            SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            pDVar6 = ASTContext::addDiag(context,(DiagCode)0x870007,SVar7);
            Diagnostic::operator<<
                      (pDVar6,(pFVar4->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
            goto LAB_003197f3;
          }
        }
        else {
          this = &syntax->expr->super_SyntaxNode;
          local_40 = slang::syntax::SyntaxNode::getFirstToken(this);
          location = parsing::Token::location(&local_40);
          local_50 = Expression::bindRValue
                               (pTVar3,(ExpressionSyntax *)this,location,context,
                                (bitmask<slang::ast::ASTFlags>)0x0);
        }
        local_40 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        expr = BumpAllocator::
               emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,assignmentTarget,local_48,&local_50,
                          (SourceRange *)&local_40);
        if ((local_50 != (Expression *)0x0) && (bVar2 = Expression::bad(local_50), bVar2)) {
          expr = (TaggedUnionExpression *)Expression::badExpr(compilation,&expr->super_Expression);
        }
        return &expr->super_Expression;
      }
      if (name._M_len != 0) {
        SVar7 = parsing::Token::range(&syntax->member);
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x33000a,SVar7);
        pDVar6 = Diagnostic::operator<<(pDVar6,name);
        ast::operator<<(pDVar6,assignmentTarget);
      }
      goto LAB_003197f3;
    }
    bVar2 = Type::isError(assignmentTarget);
    if (bVar2) goto LAB_003197f3;
  }
  SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0x880007,SVar7);
LAB_003197f3:
  pEVar5 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar5;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr,
                                syntax.expr->getFirstToken().location(), context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}